

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O3

UBool ucnv_extInitialMatchFromU_63
                (UConverter *cnv,int32_t *cx,UChar32 cp,UChar **src,UChar *srcLimit,char **target,
                char *targetLimit,int32_t **offsets,int32_t srcIndex,UBool flush,
                UErrorCode *pErrorCode)

{
  uint uVar1;
  char *pcVar2;
  uint32_t uVar3;
  long lVar4;
  char *bytes;
  UChar *src_00;
  uint32_t value;
  char local_58;
  char local_57 [39];
  
  value = 0;
  src_00 = *src;
  uVar1 = ucnv_extMatchFromU(cx,cp,(UChar *)0x0,0,src_00,
                             (int32_t)((ulong)((long)srcLimit - (long)src_00) >> 1),&value,
                             cnv->useFallback,flush);
  if ((int)uVar1 < 2) {
    if ((int)uVar1 < 0) {
      cnv->preFromUFirstCP = cp;
      if (uVar1 < 0xfffffffe) {
        lVar4 = 0;
        do {
          *(undefined2 *)((long)cnv->preFromU + lVar4) = *(undefined2 *)((long)src_00 + lVar4);
          lVar4 = lVar4 + 2;
        } while ((ulong)(-uVar1 - 2) * 2 != lVar4);
        src_00 = (UChar *)((long)src_00 + lVar4);
      }
      *src = src_00;
      cnv->preFromULength = (int8_t)(-uVar1 - 2);
      return '\x01';
    }
    if (uVar1 != 1) {
      return '\0';
    }
    cnv->useSubChar1 = '\x01';
    return '\0';
  }
  if (((value & 0x1f000000) == 0x1000000) && ((cnv->sharedData->mbcs).outputType == 0xdb)) {
    return '\0';
  }
  *src = src_00 + ((ulong)uVar1 - 2);
  uVar1 = value >> 0x18 & 0x1f;
  if (uVar1 < 4) {
    bytes = local_57;
    pcVar2 = bytes;
    if (uVar1 != 1) {
      if (uVar1 != 2) {
        if (uVar1 != 3) goto LAB_0030dbbf;
        pcVar2 = local_57 + 1;
        local_57[0] = (char)(value >> 0x10);
      }
      *pcVar2 = (char)(value >> 8);
      pcVar2 = pcVar2 + 1;
    }
    *pcVar2 = (char)value;
  }
  else {
    bytes = (char *)((long)cx + (ulong)(value & 0xffffff) + (long)cx[8]);
  }
LAB_0030dbbf:
  uVar3 = cnv->fromUnicodeStatus;
  if (uVar3 != 0) {
    if (uVar1 == 1 && 1 < (int)uVar3) {
      local_58 = '\x0f';
      uVar3 = 1;
    }
    else {
      if (uVar1 < 2 || uVar3 != 1) goto LAB_0030dc7a;
      local_58 = '\x0e';
      uVar3 = 2;
    }
    cnv->fromUnicodeStatus = uVar3;
    if (bytes != local_57) {
      memcpy(local_57,bytes,(ulong)uVar1);
    }
    uVar1 = uVar1 + 1;
    bytes = &local_58;
  }
LAB_0030dc7a:
  ucnv_fromUWriteBytes_63(cnv,bytes,uVar1,target,targetLimit,offsets,srcIndex,pErrorCode);
  return '\x01';
}

Assistant:

U_CFUNC UBool
ucnv_extInitialMatchFromU(UConverter *cnv, const int32_t *cx,
                          UChar32 cp,
                          const UChar **src, const UChar *srcLimit,
                          char **target, const char *targetLimit,
                          int32_t **offsets, int32_t srcIndex,
                          UBool flush,
                          UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    /* try to match */
    match=ucnv_extMatchFromU(cx, cp,
                             NULL, 0,
                             *src, (int32_t)(srcLimit-*src),
                             &value,
                             cnv->useFallback, flush);

    /* reject a match if the result is a single byte for DBCS-only */
    if( match>=2 &&
        !(UCNV_EXT_FROM_U_GET_LENGTH(value)==1 &&
          cnv->sharedData->mbcs.outputType==MBCS_OUTPUT_DBCS_ONLY)
    ) {
        /* advance src pointer for the consumed input */
        *src+=match-2; /* remove 2 for the initial code point */

        /* write result to target */
        ucnv_extWriteFromU(cnv, cx,
                           value,
                           target, targetLimit,
                           offsets, srcIndex,
                           pErrorCode);
        return TRUE;
    } else if(match<0) {
        /* save state for partial match */
        const UChar *s;
        int32_t j;

        /* copy the first code point */
        cnv->preFromUFirstCP=cp;

        /* now copy the newly consumed input */
        s=*src;
        match=-match-2; /* remove 2 for the initial code point */
        for(j=0; j<match; ++j) {
            cnv->preFromU[j]=*s++;
        }
        *src=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preFromULength=(int8_t)match;
        return TRUE;
    } else if(match==1) {
        /* matched, no mapping but request for <subchar1> */
        cnv->useSubChar1=TRUE;
        return FALSE;
    } else /* match==0 no match */ {
        return FALSE;
    }
}